

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_bfs.cpp
# Opt level: O0

void __thiscall
ParallelBFS::ParallelBFS(ParallelBFS *this,communicator *comm,NodeList *vertices,NodeList *edges)

{
  allocator<int> *paVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_type sVar7;
  size_type sVar8;
  size_type sVar9;
  const_reference pvVar10;
  reference pvVar11;
  int *in_values;
  int *out_values;
  value_type local_1cc;
  allocator<int> local_109;
  undefined1 local_108 [8];
  NodeList description;
  NodeId last_edge;
  NodeId this_part;
  int i;
  NodeList all_description;
  undefined1 local_c0 [8];
  NodeList first_edges;
  undefined1 local_a0 [8];
  NodeList part_edges;
  undefined1 local_80 [8];
  NodeList first_vertices;
  undefined1 local_60 [8];
  NodeList part_vertices;
  NodeId first_edge;
  NodeId first_vertex;
  NodeId left_vertices;
  NodeId part;
  NodeList *edges_local;
  NodeList *vertices_local;
  communicator *comm_local;
  ParallelBFS *this_local;
  
  this->comm = comm;
  std::vector<int,_std::allocator<int>_>::vector(&this->vertices);
  std::vector<int,_std::allocator<int>_>::vector(&this->edges);
  std::vector<int,_std::allocator<int>_>::vector(&this->distance);
  sVar7 = std::vector<int,_std::allocator<int>_>::size(vertices);
  iVar4 = boost::mpi::communicator::size();
  sVar8 = std::vector<int,_std::allocator<int>_>::size(vertices);
  iVar5 = boost::mpi::communicator::size();
  part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  iVar6 = boost::mpi::communicator::size();
  paVar1 = (allocator<int> *)
           ((long)&first_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_60,(long)iVar6,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&first_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar6 = boost::mpi::communicator::size();
  paVar1 = (allocator<int> *)
           ((long)&part_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,(long)iVar6,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&part_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar6 = boost::mpi::communicator::size();
  paVar1 = (allocator<int> *)
           ((long)&first_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a0,(long)iVar6,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&first_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar6 = boost::mpi::communicator::size();
  paVar1 = (allocator<int> *)
           ((long)&all_description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c0,(long)iVar6,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&all_description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar6 = boost::mpi::communicator::size();
  std::allocator<int>::allocator((allocator<int> *)((long)&this_part + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i,(long)(iVar6 << 2),
             (allocator<int> *)((long)&this_part + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&this_part + 3));
  last_edge = 0;
  while( true ) {
    iVar6 = boost::mpi::communicator::size();
    if (iVar6 <= last_edge) break;
    description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = (int)sVar7 / iVar4 + (uint)(last_edge < (int)sVar8 % iVar5);
    iVar6 = part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ +
            description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar9 = std::vector<int,_std::allocator<int>_>::size(vertices);
    if ((long)iVar6 == sVar9) {
      sVar9 = std::vector<int,_std::allocator<int>_>::size(edges);
      local_1cc = (value_type)sVar9;
    }
    else {
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          (vertices,(long)(part_vertices.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_end_of_storage._4_4_ +
                                          description.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
      local_1cc = *pvVar10;
    }
    description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = local_1cc;
    sVar9 = std::vector<int,_std::allocator<int>_>::size(vertices);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i,(long)(last_edge << 2));
    vVar3 = part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    *pvVar11 = (value_type)sVar9;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_80,(long)last_edge);
    *pvVar11 = vVar3;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i,(long)(last_edge * 4 + 1));
    vVar2 = description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    *pvVar11 = vVar3;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_60,(long)last_edge);
    *pvVar11 = vVar2;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i,(long)(last_edge * 4 + 2));
    *pvVar11 = vVar2;
    iVar6 = (int)description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage -
            (int)part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_a0,(long)last_edge);
    *pvVar11 = iVar6;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&i,(long)(last_edge * 4 + 3));
    vVar2 = (int)part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    *pvVar11 = iVar6;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_c0,(long)last_edge);
    *pvVar11 = vVar2;
    part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)description.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         description.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ +
         part_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._4_4_;
    last_edge = last_edge + 1;
  }
  std::allocator<int>::allocator(&local_109);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_108,4,&local_109);
  std::allocator<int>::~allocator(&local_109);
  in_values = std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)&i);
  out_values = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_108);
  boost::mpi::scatter<int>(comm,in_values,out_values,4,0);
  pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_108,0);
  this->vertex_total_count = *pvVar11;
  pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_108,1);
  this->first_vertex = *pvVar11;
  pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_108,2);
  std::vector<int,_std::allocator<int>_>::resize(&this->vertices,(long)*pvVar11);
  boost::mpi::scatterv<int>
            (comm,vertices,(vector<int,_std::allocator<int>_> *)local_60,
             (vector<int,_std::allocator<int>_> *)local_80,&this->vertices,0);
  pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_108,3);
  std::vector<int,_std::allocator<int>_>::resize(&this->edges,(long)*pvVar11);
  boost::mpi::scatterv<int>
            (comm,edges,(vector<int,_std::allocator<int>_> *)local_a0,
             (vector<int,_std::allocator<int>_> *)local_c0,&this->edges,0);
  prepare(this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_108);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_60);
  return;
}

Assistant:

ParallelBFS::ParallelBFS(const mpi::communicator &comm,
                         const NodeList &vertices,
                         const NodeList &edges) :
    comm(comm) {
  NodeId part = (NodeId)vertices.size() / comm.size(),
      left_vertices = (NodeId)vertices.size() % comm.size(),
      first_vertex = 0, first_edge = 0;
  NodeList part_vertices((size_t)comm.size());
  NodeList first_vertices((size_t)comm.size());
  NodeList part_edges((size_t)comm.size());
  NodeList first_edges((size_t)comm.size());
  NodeList all_description((size_t)(comm.size() << 2));
  for (int i = 0; i < comm.size(); ++i) {
    NodeId this_part = part + (i < left_vertices);
    NodeId last_edge = first_vertex + this_part == vertices.size() ?
                      (NodeId)edges.size() :
                      vertices[first_vertex + this_part];
    all_description[(i<<2)] = (NodeId)vertices.size();
    all_description[(i<<2) + 1] = first_vertices[i] = first_vertex;
    all_description[(i<<2) + 2] = part_vertices[i] = this_part;
    all_description[(i<<2) + 3] = part_edges[i] = last_edge - first_edge;
    first_edges[i] = first_edge;
    first_edge = last_edge;
    first_vertex += this_part;
  }
  NodeList description(4);
  mpi::scatter(comm, all_description.data(), description.data(), 4, 0);
  this->vertex_total_count = description[0];
  this->first_vertex = description[1];
  this->vertices.resize((size_t)description[2]);
  mpi::scatterv(comm, vertices, part_vertices, first_vertices,
                this->vertices, 0);
  this->edges.resize((size_t)description[3]);
  mpi::scatterv(comm, edges, part_edges, first_edges,
                this->edges, 0);
  prepare();
}